

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

DatabaseInterface * Fossilize::create_zip_archive_database(char *path,DatabaseMode mode)

{
  char *pcVar1;
  ZipDatabase *this;
  allocator local_41;
  string local_40;
  ZipDatabase *db;
  char *pcStack_10;
  DatabaseMode mode_local;
  char *path_local;
  
  db._4_4_ = mode;
  pcStack_10 = path;
  this = (ZipDatabase *)operator_new(0x2d8);
  pcVar1 = pcStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  ZipDatabase::ZipDatabase(this,&local_40,db._4_4_);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_zip_archive_database(const char *path, DatabaseMode mode)
{
	auto *db = new ZipDatabase(path, mode);
	return db;
}